

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall wasm::AfterEffectFunctionChecker::check(AfterEffectFunctionChecker *this)

{
  bool bVar1;
  Fatal local_1a0;
  size_t local_18;
  size_t after;
  AfterEffectFunctionChecker *this_local;
  
  after = (size_t)this;
  bVar1 = IString::operator==((IString *)this->func,&(this->name).super_IString);
  if (!bVar1) {
    __assert_fail("func->name == name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                  ,0x372,"void wasm::AfterEffectFunctionChecker::check()");
  }
  if ((((this->beganWithStackIR & 1U) != 0) &&
      (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->func->stackIR), bVar1))
     && (local_18 = FunctionHasher::hashFunction(this->func), local_18 != this->originalFunctionHash
        )) {
    Fatal::Fatal(&local_1a0);
    Fatal::operator<<(&local_1a0,
                      (char (*) [196])
                      "[PassRunner] PASS_DEBUG check failed: had Stack IR before and after the pass ran, and the pass modified the main IR, which invalidates Stack IR - pass should have been marked \'modifiesBinaryenIR\'"
                     );
    Fatal::~Fatal(&local_1a0);
  }
  return;
}

Assistant:

void check() {
    assert(func->name == name); // no global module changes should have occurred
    if (beganWithStackIR && func->stackIR) {
      auto after = FunctionHasher::hashFunction(func);
      if (after != originalFunctionHash) {
        Fatal() << "[PassRunner] PASS_DEBUG check failed: had Stack IR before "
                   "and after the pass ran, and the pass modified the main IR, "
                   "which invalidates Stack IR - pass should have been marked "
                   "'modifiesBinaryenIR'";
      }
    }
  }